

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void flush_bits_e(huff_entropy_ptr entropy)

{
  long in_RDI;
  int in_stack_00000008;
  uint in_stack_0000000c;
  huff_entropy_ptr in_stack_00000010;
  
  emit_bits_e(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  return;
}

Assistant:

LOCAL(void)
flush_bits_e (huff_entropy_ptr entropy)
{
  emit_bits_e(entropy, 0x7F, 7); /* fill any partial byte with ones */
  entropy->saved.put_buffer = 0; /* and reset bit-buffer to empty */
  entropy->saved.put_bits = 0;
}